

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void upb_inttable_removeiter(upb_inttable *t,intptr_t *iter)

{
  byte bVar1;
  ulong uVar2;
  upb_tabent *puVar3;
  _upb_tabent *p_Var4;
  long lVar5;
  long lVar6;
  upb_tabent *puVar7;
  
  uVar2 = *iter;
  if (uVar2 < t->array_size) {
    t->array_count = t->array_count - 1;
    t->array[uVar2].val = 0xffffffffffffffff;
    return;
  }
  puVar3 = (t->t).entries;
  bVar1 = (t->t).size_lg2;
  p_Var4 = puVar3 + (uVar2 - t->array_size);
  lVar6 = 0;
  lVar5 = (long)(1 << (bVar1 & 0x1f));
  if (bVar1 == 0) {
    lVar5 = lVar6;
  }
  puVar7 = puVar3;
  do {
    if (lVar5 * 0x18 - lVar6 == 0) {
LAB_00124c64:
      (t->t).count = (t->t).count - 1;
      p_Var4->key = 0;
      p_Var4->next = (_upb_tabent *)0x0;
      return;
    }
    if (puVar7->next == p_Var4) {
      *(_upb_tabent **)((long)&puVar3->next + lVar6) = p_Var4->next;
      goto LAB_00124c64;
    }
    puVar7 = puVar7 + 1;
    lVar6 = lVar6 + 0x18;
  } while( true );
}

Assistant:

void upb_inttable_removeiter(upb_inttable* t, intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)i < t->array_size) {
    t->array_count--;
    mutable_array(t)[i].val = -1;
  } else {
    upb_tabent* ent = &t->t.entries[i - t->array_size];
    upb_tabent* prev = NULL;

    // Linear search, not great.
    upb_tabent* end = &t->t.entries[upb_table_size(&t->t)];
    for (upb_tabent* e = t->t.entries; e != end; e++) {
      if (e->next == ent) {
        prev = e;
        break;
      }
    }

    if (prev) {
      prev->next = ent->next;
    }

    t->t.count--;
    ent->key = 0;
    ent->next = NULL;
  }
}